

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O0

void __thiscall
CaDiCaL::LratChecker::add_derived_clause
          (LratChecker *this,uint64_t id,bool param_3,vector<int,_std::allocator<int>_> *c,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *proof_chain)

{
  long lVar1;
  bool bVar2;
  uint *puVar3;
  time_t *in_RSI;
  FILE *__timer;
  long in_RDI;
  LratChecker *in_R8;
  double s;
  double s_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  LratChecker *in_stack_00000008;
  int *lit;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  LratCheckerClause *d;
  LratCheckerClause **p;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff20;
  Internal *pIVar4;
  undefined5 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  byte bVar5;
  byte bVar6;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff70;
  undefined1 local_78 [64];
  LratCheckerClause *local_38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd0;
  
  if (*(int *)(*(long *)(in_RDI + 8) + 0x1680) <= *(int *)(*(long *)(in_RDI + 8) + 0xe18)) {
    pIVar4 = *(Internal **)(in_RDI + 8);
    lVar1 = *(long *)(in_RDI + 8);
    Internal::time(*(Internal **)(in_RDI + 8),in_RSI);
    Internal::start_profiling(pIVar4,(Profile *)(lVar1 + 0x1660),s);
  }
  *(long *)(in_RDI + 0x158) = *(long *)(in_RDI + 0x158) + 1;
  *(long *)(in_RDI + 0x168) = *(long *)(in_RDI + 0x168) + 1;
  import_clause((LratChecker *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                in_stack_ffffffffffffff38);
  *(time_t **)(in_RDI + 0x148) = in_RSI;
  *(time_t **)(in_RDI + 0x150) = in_RSI;
  if (*(long *)(in_RDI + 0xd8) != 0) {
    in_stack_ffffffffffffffd0 =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         find((LratChecker *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
              (uint64_t)in_stack_ffffffffffffff38);
    local_38 = (LratCheckerClause *)
               (in_stack_ffffffffffffffd0->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if (local_38 != (LratCheckerClause *)0x0) {
      fatal_message_start();
      fputs("different clause with id ",_stderr);
      fprintf(_stderr,"%ld",in_RSI);
      fputs(" already present\n",_stderr);
      fatal_message_end();
    }
  }
  __timer = (FILE *)(local_78 + 0x28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_ffffffffffffff70._M_current,in_stack_ffffffffffffff68);
  bVar2 = check(in_stack_00000008,unaff_retaddr);
  bVar5 = 1;
  bVar6 = bVar5;
  if (bVar2) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_ffffffffffffff70._M_current,in_stack_ffffffffffffff68);
    __timer = (FILE *)local_78;
    in_stack_ffffffffffffff36 = check_resolution(in_R8,in_stack_ffffffffffffffd0);
    bVar5 = in_stack_ffffffffffffff36 ^ 0xff;
    bVar6 = bVar5;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               (CONCAT17(in_stack_ffffffffffffff36,
                         CONCAT16(in_stack_ffffffffffffff36,
                                  CONCAT15(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30))) ^
               0xff00ff0000000000));
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(bVar6,CONCAT16(in_stack_ffffffffffffff36,
                                     CONCAT15(bVar5,in_stack_ffffffffffffff30))));
  if ((bVar5 & 1) == 0) {
    insert((LratChecker *)
           CONCAT17(bVar6,CONCAT16(in_stack_ffffffffffffff36,
                                   CONCAT15(bVar5,in_stack_ffffffffffffff30))));
  }
  else {
    fatal_message_start();
    fputs("failed to check derived clause:\n",_stderr);
    std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff18);
    std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff18);
    while (bVar2 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff20,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_ffffffffffffff18), bVar2) {
      puVar3 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)&stack0xffffffffffffff70);
      fprintf(_stderr,"%d ",(ulong)*puVar3);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffff70);
    }
    __timer = _stderr;
    fputc(0x30,_stderr);
    fatal_message_end();
  }
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0xdcbca8);
  if (*(int *)(*(long *)(in_RDI + 8) + 0x1680) <= *(int *)(*(long *)(in_RDI + 8) + 0xe18)) {
    pIVar4 = *(Internal **)(in_RDI + 8);
    lVar1 = *(long *)(in_RDI + 8);
    Internal::time(*(Internal **)(in_RDI + 8),(time_t *)__timer);
    Internal::stop_profiling(pIVar4,(Profile *)(lVar1 + 0x1660),s_00);
  }
  return;
}

Assistant:

void LratChecker::add_derived_clause (uint64_t id, bool,
                                      const vector<int> &c,
                                      const vector<uint64_t> &proof_chain) {
  START (checking);
  LOG (c, "LRAT CHECKER addition of derived clause[%" PRIu64 "]", id);
  stats.added++;
  stats.derived++;
  import_clause (c);
  last_id = id;
  assert (id == current_id + 1);
  current_id = id;
  if (size_clauses) {
    LratCheckerClause **p = find (id), *d = *p;
    if (d) {
      fatal_message_start ();
      fputs ("different clause with id ", stderr);
      fprintf (stderr, "%" PRId64, id);
      fputs (" already present\n", stderr);
      fatal_message_end ();
    }
  }
  assert (id);
  if (!check (proof_chain) || !check_resolution (proof_chain)) {
    fatal_message_start ();
    fputs ("failed to check derived clause:\n", stderr);
    for (const auto &lit : imported_clause)
      fprintf (stderr, "%d ", lit);
    fputc ('0', stderr);
    fatal_message_end ();
  } else
    insert ();
  imported_clause.clear ();
  STOP (checking);
}